

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

string * __thiscall
cmQtAutoGenerator::Logger::HeadLine_abi_cxx11_
          (string *__return_storage_ptr__,Logger *this,string_view title)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  long *local_118;
  undefined8 local_110;
  long local_108 [2];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined1 *local_e8;
  undefined1 local_e0 [32];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_88;
  undefined8 local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  long *local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,(char)this);
  local_88.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b0 = local_a8;
  local_c0 = 0;
  local_b8 = 1;
  local_a8[0] = 10;
  local_70 = 1;
  local_60 = 0;
  local_58 = local_110;
  local_50 = local_118;
  local_e8 = local_e0;
  local_f8 = 0;
  local_f0 = 1;
  local_e0[0] = 10;
  local_40 = 1;
  local_30 = 0;
  views._M_len = 4;
  views._M_array = &local_88;
  local_88.first._M_len = (size_t)this;
  local_88.first._M_str = (char *)title._M_len;
  local_68 = local_b0;
  local_48 = (undefined1 *)&local_118;
  local_38 = local_e8;
  cmCatViews(__return_storage_ptr__,views);
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerator::Logger::HeadLine(cm::string_view title)
{
  return cmStrCat(title, '\n', std::string(title.size(), '-'), '\n');
}